

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

double __thiscall libchars::debug::log(debug *this,double __x)

{
  FILE *__stream;
  char in_AL;
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uVar5;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_R8;
  char *in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 local_108 [48];
  double local_d8;
  undefined4 local_58;
  undefined4 local_54;
  va_list arguments;
  char *format_local;
  char *function_local;
  uint line_local;
  char *file_local;
  uint lvl_local;
  debug *this_local;
  
  if (in_AL != '\0') {
    local_d8 = __x;
  }
  if (in_ESI <= this->log_level) {
    if ((this->initialized & 1U) == 0) {
      initialize__(this);
      __x = extraout_XMM0_Qa;
    }
    if (_d_ != (FILE *)0x0) {
      arguments[0].overflow_arg_area = local_108;
      arguments[0]._0_8_ = &stack0x00000008;
      local_54 = 0x30;
      local_58 = 0x30;
      pcVar1 = (char *)__tls_get_addr(&PTR_00149f68);
      snprintf(pcVar1,0x2000,"%s:%u:%s() ",in_RDX,(ulong)in_ECX,in_R8);
      lVar2 = __tls_get_addr(&PTR_00149f68);
      pcVar1 = (char *)__tls_get_addr(&PTR_00149f68);
      sVar3 = strlen(pcVar1);
      pcVar1 = (char *)__tls_get_addr(&PTR_00149f68);
      sVar4 = strlen(pcVar1);
      vsnprintf((char *)(lVar2 + sVar3),0x2000 - sVar4,in_R9,&local_58);
      __stream = _d_;
      uVar5 = __tls_get_addr(&PTR_00149f68);
      fprintf(__stream,"%s\n",uVar5);
      fflush(_d_);
      __x = extraout_XMM0_Qa_00;
    }
  }
  return __x;
}

Assistant:

void debug::log(unsigned int lvl, const char *file, unsigned int line, const char *function, const char *format, ...)
    {
        if (lvl <= log_level) {
            if (!initialized) {
                initialize__();
            }
            if (_d_ != NULL) {
                static __thread char buffer[8192];
                va_list arguments;
                va_start(arguments, format);
                snprintf(buffer, sizeof(buffer), "%s:%u:%s() ", file, line, function);
                vsnprintf(buffer+strlen(buffer), sizeof(buffer)-strlen(buffer), format, arguments);
                va_end(arguments);
                fprintf(_d_,"%s\n",buffer);
                fflush(_d_);
            }
        }
    }